

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

bool __thiscall
DescriptorCache::GetCachedDerivedExtPubKey
          (DescriptorCache *this,uint32_t key_exp_pos,uint32_t der_index,CExtPubKey *xpub)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  long lVar4;
  undefined4 *puVar5;
  CExtPubKey *pCVar6;
  long in_FS_OFFSET;
  byte bVar7;
  uint32_t local_18;
  uint32_t local_14;
  long local_10;
  
  bVar7 = 0;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = der_index;
  local_14 = key_exp_pos;
  cVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_14);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    cVar3 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)cVar2.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
                             ._M_cur + 0x10),&local_18);
    if (cVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>._M_cur !=
        (__node_type *)0x0) {
      puVar5 = (undefined4 *)
               ((long)cVar3.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>.
                      _M_cur + 0xc);
      pCVar6 = xpub;
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined4 *)pCVar6->version = *puVar5;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
        pCVar6 = (CExtPubKey *)((long)pCVar6 + (ulong)bVar7 * -8 + 4);
      }
      (xpub->pubkey).vch[0x40] =
           *(uchar *)((long)cVar3.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                            ._M_cur + 0x7c);
      bVar1 = true;
      goto LAB_0038a4c8;
    }
  }
  bVar1 = false;
LAB_0038a4c8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorCache::GetCachedDerivedExtPubKey(uint32_t key_exp_pos, uint32_t der_index, CExtPubKey& xpub) const
{
    const auto& key_exp_it = m_derived_xpubs.find(key_exp_pos);
    if (key_exp_it == m_derived_xpubs.end()) return false;
    const auto& der_it = key_exp_it->second.find(der_index);
    if (der_it == key_exp_it->second.end()) return false;
    xpub = der_it->second;
    return true;
}